

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O1

void __thiscall
Assimp::XFileParser::XFileParser(XFileParser *this,vector<char,_std::allocator<char>_> *pBuffer)

{
  char **ppcVar1;
  char *pcVar2;
  ushort uVar3;
  Node *pNode;
  bool bVar4;
  int iVar5;
  uint uVar6;
  Logger *this_00;
  Scene *pSVar7;
  runtime_error *prVar8;
  ushort *puVar9;
  bool bVar10;
  size_type __new_size;
  ulong uVar11;
  char *pcVar12;
  pointer pcVar13;
  vector<char,_std::allocator<char>_> uncompressed;
  z_stream stream;
  char local_1e9;
  string local_1e8;
  vector<char,_std::allocator<char>_> local_1c8;
  ushort *local_1a8;
  uint local_1a0;
  ushort local_198 [4];
  char *local_190;
  int local_188;
  code *local_168;
  code *local_160;
  undefined8 local_158;
  uint local_150;
  
  this->mBinaryNumCount = 0;
  this->mScene = (Scene *)0x0;
  this->mMajorVersion = 0;
  this->mMinorVersion = 0;
  this->mIsBinaryFormat = false;
  this->mP = (char *)0x0;
  this->mEnd = (char *)0x0;
  this->mLineNumber = 0;
  local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pcVar12 = (pBuffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
            super__Vector_impl_data._M_start;
  this->mP = pcVar12;
  this->mEnd = pcVar12 + (long)((pBuffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                super__Vector_impl_data._M_finish +
                               (-1 - (long)(pBuffer->super__Vector_base<char,_std::allocator<char>_>
                                           )._M_impl.super__Vector_impl_data._M_start));
  iVar5 = strncmp(pcVar12,"xof ",4);
  if (iVar5 != 0) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1a8 = local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1a8,"Header mismatch, file is not an XFile.","");
    std::runtime_error::runtime_error(prVar8,(string *)&local_1a8);
    *(undefined ***)prVar8 = &PTR__runtime_error_007fa260;
    __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  ppcVar1 = &this->mP;
  this->mMajorVersion = ((int)pcVar12[5] + pcVar12[4] * 10) - 0x210;
  this->mMinorVersion = ((int)pcVar12[7] + pcVar12[6] * 10) - 0x210;
  pcVar2 = pcVar12 + 8;
  iVar5 = strncmp(pcVar2,"txt ",4);
  if (iVar5 == 0) {
    bVar10 = false;
  }
  else {
    iVar5 = strncmp(pcVar2,"bin ",4);
    if (iVar5 != 0) {
      iVar5 = strncmp(pcVar2,"tzip",4);
      if (iVar5 == 0) {
        bVar4 = true;
        bVar10 = false;
      }
      else {
        iVar5 = strncmp(pcVar2,"bzip",4);
        bVar10 = true;
        bVar4 = true;
        if (iVar5 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"Unsupported xfile format \'",0x1a);
          local_1e9 = (*ppcVar1)[8];
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,&local_1e9,1);
          local_1e9 = (*ppcVar1)[9];
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,&local_1e9,1);
          local_1e9 = (*ppcVar1)[10];
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,&local_1e9,1);
          local_1e9 = (*ppcVar1)[0xb];
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,&local_1e9,1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\'",1);
          std::__cxx11::stringbuf::str();
          ThrowException(this,&local_1e8);
        }
      }
      goto LAB_0060b194;
    }
    bVar10 = true;
  }
  bVar4 = false;
LAB_0060b194:
  this->mIsBinaryFormat = bVar10;
  iVar5 = pcVar12[0xd] * 100 + pcVar12[0xc] * 1000 + pcVar12[0xe] * 10;
  uVar6 = (pcVar12[0xf] + iVar5) - 0xd050;
  iVar5 = iVar5 + pcVar12[0xf];
  this->mBinaryFloatSize = uVar6;
  if ((iVar5 != 0xd070) && (iVar5 != 0xd090)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Unknown float size ",0x13);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8," specified in xfile header.",0x1b);
    std::__cxx11::stringbuf::str();
    ThrowException(this,&local_1e8);
  }
  this->mBinaryFloatSize = uVar6 >> 3;
  this->mP = pcVar12 + 0x10;
  if (bVar4) {
    local_158 = 0;
    local_168 = dummy_alloc;
    local_160 = dummy_free;
    local_150 = this->mIsBinaryFormat ^ 1;
    inflateInit2_(&local_1a8,0xfffffff1,"1.2.11",0x70);
    pcVar12 = this->mP;
    puVar9 = (ushort *)(pcVar12 + 6);
    this->mP = (char *)puVar9;
    __new_size = 1;
    if (pcVar12 + 9 < this->mEnd) {
      uVar6 = 1;
      do {
        uVar11 = (ulong)*puVar9;
        if (0x8011 < uVar11) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1e8,"X: Invalid offset to next MSZIP compressed block","");
          std::runtime_error::runtime_error(prVar8,(string *)&local_1e8);
          *(undefined ***)prVar8 = &PTR__runtime_error_007fa260;
          __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        if (puVar9[1] != 0x4b43) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1e8,"X: Unsupported compressed format, expected MSZIP header",
                     "");
          std::runtime_error::runtime_error(prVar8,(string *)&local_1e8);
          *(undefined ***)prVar8 = &PTR__runtime_error_007fa260;
          __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        pcVar12 = (char *)((long)puVar9 + uVar11 + 7);
        puVar9 = (ushort *)((long)puVar9 + uVar11 + 4);
        uVar6 = uVar6 + 0x8012;
      } while (pcVar12 < this->mEnd);
      __new_size = (size_type)uVar6;
    }
    std::vector<char,_std::allocator<char>_>::resize(&local_1c8,__new_size);
    puVar9 = (ushort *)this->mP;
    pcVar12 = this->mEnd;
    pcVar13 = local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((char *)((long)puVar9 + 3U) < pcVar12) {
      do {
        uVar3 = *puVar9;
        uVar11 = (ulong)uVar3;
        *ppcVar1 = (char *)(puVar9 + 2);
        if (pcVar12 + 2 < (char *)((long)puVar9 + uVar11 + 4)) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1e8,"X: Unexpected EOF in compressed chunk","");
          std::runtime_error::runtime_error(prVar8,(string *)&local_1e8);
          *(undefined ***)prVar8 = &PTR__runtime_error_007fa260;
          __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        local_1a0 = (uint)uVar3;
        local_188 = 0x8012;
        local_1a8 = puVar9 + 2;
        local_190 = pcVar13;
        uVar6 = inflate(&local_1a8,2);
        if (1 < uVar6) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1e8,"X: Failed to decompress MSZIP-compressed data","");
          std::runtime_error::runtime_error(prVar8,(string *)&local_1e8);
          *(undefined ***)prVar8 = &PTR__runtime_error_007fa260;
          __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        inflateReset(&local_1a8);
        inflateSetDictionary(&local_1a8,pcVar13,0x8012 - local_188);
        pcVar13 = pcVar13 + (0x8012 - local_188);
        pcVar2 = this->mP;
        pcVar12 = this->mEnd;
        puVar9 = (ushort *)(pcVar2 + uVar11);
        this->mP = (char *)puVar9;
      } while (pcVar2 + uVar11 + 3 < pcVar12);
    }
    inflateEnd(&local_1a8);
    this->mP = local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
    this->mEnd = pcVar13;
    this_00 = DefaultLogger::get();
    Logger::info(this_00,"Successfully decompressed MSZIP-compressed file");
  }
  else {
    ReadUntilEndOfLine(this);
  }
  pSVar7 = (Scene *)operator_new(0x58);
  (pSVar7->mAnims).
  super__Vector_base<Assimp::XFile::Animation_*,_std::allocator<Assimp::XFile::Animation_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pSVar7->mAnims).
  super__Vector_base<Assimp::XFile::Animation_*,_std::allocator<Assimp::XFile::Animation_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pSVar7->mGlobalMaterials).
  super__Vector_base<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pSVar7->mAnims).
  super__Vector_base<Assimp::XFile::Animation_*,_std::allocator<Assimp::XFile::Animation_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pSVar7->mGlobalMaterials).
  super__Vector_base<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pSVar7->mGlobalMaterials).
  super__Vector_base<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pSVar7->mGlobalMeshes).
  super__Vector_base<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pSVar7->mGlobalMeshes).
  super__Vector_base<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar7->mRootNode = (Node *)0x0;
  (pSVar7->mGlobalMeshes).
  super__Vector_base<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pSVar7->mAnimTicksPerSecond = 0;
  this->mScene = pSVar7;
  ParseFile(this);
  pNode = this->mScene->mRootNode;
  if (pNode != (Node *)0x0) {
    FilterHierarchy(this,pNode);
  }
  if (local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

XFileParser::XFileParser( const std::vector<char>& pBuffer)
: mMajorVersion( 0 )
, mMinorVersion( 0 )
, mIsBinaryFormat( false )
, mBinaryNumCount( 0 )
, mP( nullptr )
, mEnd( nullptr )
, mLineNumber( 0 )
, mScene( nullptr ) {
    // vector to store uncompressed file for INFLATE'd X files
    std::vector<char> uncompressed;

    // set up memory pointers
    mP = &pBuffer.front();
    mEnd = mP + pBuffer.size() - 1;

    // check header
    if ( 0 != strncmp( mP, "xof ", 4 ) ) {
        throw DeadlyImportError( "Header mismatch, file is not an XFile." );
    }

    // read version. It comes in a four byte format such as "0302"
    mMajorVersion = (unsigned int)(mP[4] - 48) * 10 + (unsigned int)(mP[5] - 48);
    mMinorVersion = (unsigned int)(mP[6] - 48) * 10 + (unsigned int)(mP[7] - 48);

    bool compressed = false;

    // txt - pure ASCII text format
    if( strncmp( mP + 8, "txt ", 4) == 0)
        mIsBinaryFormat = false;

    // bin - Binary format
    else if( strncmp( mP + 8, "bin ", 4) == 0)
        mIsBinaryFormat = true;

    // tzip - Inflate compressed text format
    else if( strncmp( mP + 8, "tzip", 4) == 0)
    {
        mIsBinaryFormat = false;
        compressed = true;
    }
    // bzip - Inflate compressed binary format
    else if( strncmp( mP + 8, "bzip", 4) == 0)
    {
        mIsBinaryFormat = true;
        compressed = true;
    }
    else ThrowException( format() << "Unsupported xfile format '" <<
       mP[8] << mP[9] << mP[10] << mP[11] << "'");

    // float size
    mBinaryFloatSize = (unsigned int)(mP[12] - 48) * 1000
        + (unsigned int)(mP[13] - 48) * 100
        + (unsigned int)(mP[14] - 48) * 10
        + (unsigned int)(mP[15] - 48);

    if( mBinaryFloatSize != 32 && mBinaryFloatSize != 64)
        ThrowException( format() << "Unknown float size " << mBinaryFloatSize << " specified in xfile header." );

    // The x format specifies size in bits, but we work in bytes
    mBinaryFloatSize /= 8;

    mP += 16;

    // If this is a compressed X file, apply the inflate algorithm to it
    if (compressed)
    {
#ifdef ASSIMP_BUILD_NO_COMPRESSED_X
        throw DeadlyImportError("Assimp was built without compressed X support");
#else
        /* ///////////////////////////////////////////////////////////////////////
         * COMPRESSED X FILE FORMAT
         * ///////////////////////////////////////////////////////////////////////
         *    [xhead]
         *    2 major
         *    2 minor
         *    4 type    // bzip,tzip
         *    [mszip_master_head]
         *    4 unkn    // checksum?
         *    2 unkn    // flags? (seems to be constant)
         *    [mszip_head]
         *    2 ofs     // offset to next section
         *    2 magic   // 'CK'
         *    ... ofs bytes of data
         *    ... next mszip_head
         *
         *  http://www.kdedevelopers.org/node/3181 has been very helpful.
         * ///////////////////////////////////////////////////////////////////////
         */

        // build a zlib stream
        z_stream stream;
        stream.opaque = NULL;
        stream.zalloc = &dummy_alloc;
        stream.zfree  = &dummy_free;
        stream.data_type = (mIsBinaryFormat ? Z_BINARY : Z_ASCII);

        // initialize the inflation algorithm
        ::inflateInit2(&stream, -MAX_WBITS);

        // skip unknown data (checksum, flags?)
        mP += 6;

        // First find out how much storage we'll need. Count sections.
        const char* P1       = mP;
        unsigned int est_out = 0;

        while (P1 + 3 < mEnd)
        {
            // read next offset
            uint16_t ofs = *((uint16_t*)P1);
            AI_SWAP2(ofs); P1 += 2;

            if (ofs >= MSZIP_BLOCK)
                throw DeadlyImportError("X: Invalid offset to next MSZIP compressed block");

            // check magic word
            uint16_t magic = *((uint16_t*)P1);
            AI_SWAP2(magic); P1 += 2;

            if (magic != MSZIP_MAGIC)
                throw DeadlyImportError("X: Unsupported compressed format, expected MSZIP header");

            // and advance to the next offset
            P1 += ofs;
            est_out += MSZIP_BLOCK; // one decompressed block is 32786 in size
        }

        // Allocate storage and terminating zero and do the actual uncompressing
        uncompressed.resize(est_out + 1);
        char* out = &uncompressed.front();
        while (mP + 3 < mEnd)
        {
            uint16_t ofs = *((uint16_t*)mP);
            AI_SWAP2(ofs);
            mP += 4;

            if (mP + ofs > mEnd + 2) {
                throw DeadlyImportError("X: Unexpected EOF in compressed chunk");
            }

            // push data to the stream
            stream.next_in   = (Bytef*)mP;
            stream.avail_in  = ofs;
            stream.next_out  = (Bytef*)out;
            stream.avail_out = MSZIP_BLOCK;

            // and decompress the data ....
            int ret = ::inflate( &stream, Z_SYNC_FLUSH );
            if (ret != Z_OK && ret != Z_STREAM_END)
                throw DeadlyImportError("X: Failed to decompress MSZIP-compressed data");

            ::inflateReset( &stream );
            ::inflateSetDictionary( &stream, (const Bytef*)out , MSZIP_BLOCK - stream.avail_out );

            // and advance to the next offset
            out +=  MSZIP_BLOCK - stream.avail_out;
            mP   += ofs;
        }

        // terminate zlib
        ::inflateEnd(&stream);

        // ok, update pointers to point to the uncompressed file data
        mP = &uncompressed[0];
        mEnd = out;

        // FIXME: we don't need the compressed data anymore, could release
        // it already for better memory usage. Consider breaking const-co.
        ASSIMP_LOG_INFO("Successfully decompressed MSZIP-compressed file");
#endif // !! ASSIMP_BUILD_NO_COMPRESSED_X
    }
    else
    {
        // start reading here
        ReadUntilEndOfLine();
    }

    mScene = new Scene;
    ParseFile();

    // filter the imported hierarchy for some degenerated cases
    if( mScene->mRootNode) {
        FilterHierarchy( mScene->mRootNode);
    }
}